

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O2

uint32_t imageio::convertSFloatToUInt(uint32_t rawBits,uint32_t numBits)

{
  if (numBits == 0x10) {
    rawBits = (uint32_t)half_to_float((uint16_t)rawBits);
  }
  else if (numBits != 0x20) {
    __assert_fail("numBits == 16 || numBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                  ,0xd2,"uint32_t imageio::convertSFloatToUInt(uint32_t, uint32_t)");
  }
  return (uint32_t)(long)(float)rawBits;
}

Assistant:

[[nodiscard]] inline uint32_t convertSFloatToUInt(uint32_t rawBits, uint32_t numBits) {
    assert(numBits == 16 || numBits == 32);
    if (numBits == 16)
        return static_cast<uint32_t>(half_to_float(static_cast<uint16_t>(rawBits)));
    if (numBits == 32)
        return static_cast<uint32_t>(bit_cast<float>(rawBits));
    return 0;
}